

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

void __thiscall QDateTime::setMSecsSinceEpoch(QDateTime *this,qint64 msecs)

{
  QDateTimePrivate *pQVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  Int IVar6;
  long in_FS_OFFSET;
  bool bVar7;
  ZoneState local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    IVar6 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    IVar6 = (Int)(byte)pQVar1;
  }
  uVar2 = IVar6 >> 4 & 3;
  uVar5 = IVar6 & 0xfffffff1;
  if (uVar2 - 1 < 2) {
    local_50.offset = 0;
    if (uVar2 == 2) {
      iVar4 = pQVar1->m_offsetFromUtc;
      local_50.offset = 0;
      if (((long)iVar4 != 0) &&
         (lVar3 = (long)iVar4 * 1000, bVar7 = SCARRY8(msecs,lVar3), msecs = msecs + lVar3,
         local_50.offset = iVar4, bVar7)) goto LAB_00120689;
    }
  }
  else {
    iVar4 = 0;
    if ((uVar2 != 0) ||
       (QDateTimePrivate::expressUtcAsLocal(&local_50,msecs), msecs = local_50.when,
       iVar4 = local_50.offset, (local_50.valid & 1U) == 0)) goto LAB_00120689;
    IVar6 = IVar6 & 0xffffff31;
    if (local_50.dst == StandardTime) {
      uVar5 = IVar6 | 0x4e;
      goto LAB_00120689;
    }
    if (local_50.dst == DaylightTime) {
      uVar5 = IVar6 | 0x8e;
      goto LAB_00120689;
    }
  }
  uVar5 = IVar6 | 0xe;
  iVar4 = local_50.offset;
LAB_00120689:
  if ((msecs + 0x80000000000000U >> 0x38 == 0) && (((ulong)this->d & 1) != 0)) {
    (this->d).d = (QDateTimePrivate *)((ulong)(uVar5 & 0xff) | msecs << 8);
  }
  else {
    Data::detach((Data *)this);
    (((this->d).d)->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = uVar5 & 0xfffffffe;
    ((this->d).d)->m_msecs = msecs;
    ((this->d).d)->m_offsetFromUtc = iVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTime::setMSecsSinceEpoch(qint64 msecs)
{
    auto status = getStatus(d);
    const auto spec = extractSpec(status);
    Q_ASSERT(specCanBeSmall(spec) || !d.isShort());
    QDateTimePrivate::ZoneState state(msecs);

    status &= ~QDateTimePrivate::ValidityMask;
    if (QTimeZone::isUtcOrFixedOffset(spec)) {
        if (spec == Qt::OffsetFromUTC)
            state.offset = d->m_offsetFromUtc;
        if (!state.offset || !qAddOverflow(msecs, state.offset * MSECS_PER_SEC, &state.when))
            status |= QDateTimePrivate::ValidityMask;
    } else if (spec == Qt::LocalTime) {
        state = QDateTimePrivate::expressUtcAsLocal(msecs);
        if (state.valid)
            status = mergeDaylightStatus(status | QDateTimePrivate::ValidityMask, state.dst);
#if QT_CONFIG(timezone)
    } else if (spec == Qt::TimeZone && (d.detach(), d->m_timeZone.isValid())) {
        const auto data = d->m_timeZone.d->data(msecs);
        if (Q_LIKELY(data.offsetFromUtc != QTimeZonePrivate::invalidSeconds())) {
            state.offset = data.offsetFromUtc;
            Q_ASSERT(state.offset >= -SECS_PER_DAY && state.offset <= SECS_PER_DAY);
            if (!state.offset
                || !Q_UNLIKELY(qAddOverflow(msecs, state.offset * MSECS_PER_SEC, &state.when))) {
                d->m_status = mergeDaylightStatus(status | QDateTimePrivate::ValidityMask,
                                                  data.daylightTimeOffset
                                                  ? QDateTimePrivate::DaylightTime
                                                  : QDateTimePrivate::StandardTime);
                d->m_msecs = state.when;
                d->m_offsetFromUtc = state.offset;
                return;
            } // else: zone can't represent this UTC time
        } // else: zone unable to represent given UTC time (should only happen on overflow).
#endif // timezone
    }
    Q_ASSERT(!status.testFlag(QDateTimePrivate::ValidDateTime)
             || (state.offset >= -SECS_PER_DAY && state.offset <= SECS_PER_DAY));

    if (msecsCanBeSmall(state.when) && d.isShort()) {
        // we can keep short
        d.data.msecs = qintptr(state.when);
        d.data.status = status.toInt();
    } else {
        d.detach();
        d->m_status = status & ~QDateTimePrivate::ShortData;
        d->m_msecs = state.when;
        d->m_offsetFromUtc = state.offset;
    }
}